

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96_test.c
# Opt level: O2

void brngCTRXStepR(void *buf,size_t count,void *stack)

{
  ulong count_00;
  void *src;
  void *dest;
  long lVar1;
  size_t count_01;
  
  dest = buf;
  count_01 = count;
  while (count_01 != 0) {
    count_00 = *(long *)((long)stack + 8) - *(long *)((long)stack + 0x10);
    src = (void *)(*(long *)((long)stack + 0x10) + *stack);
    if (count_01 < count_00) {
      memCopy(dest,src,count_01);
      lVar1 = count_01 + *(long *)((long)stack + 0x10);
      count_01 = 0;
    }
    else {
      memCopy(dest,src,count_00);
      lVar1 = *(long *)((long)stack + 8) - *(long *)((long)stack + 0x10);
      dest = (void *)((long)dest + lVar1);
      count_01 = count_01 - lVar1;
      lVar1 = 0;
    }
    *(long *)((long)stack + 0x10) = lVar1;
  }
  brngCTRStepR(buf,count,(void *)((long)stack + 0x18));
  return;
}

Assistant:

static void brngCTRXStepR(void* buf, size_t count, void* stack)
{
	brng_ctrx_st* s = (brng_ctrx_st*)stack;
	octet* buf1 = (octet*)buf;
	size_t count1 = count;
	ASSERT(memIsValid(s, sizeof(brng_ctrx_st)));
	// заполнить buf
	while (count1)
		if (count1 < s->count - s->offset)
		{
			memCopy(buf1, s->X + s->offset, count1);
			s->offset += count1;
			count1 = 0;
		}
		else
		{
			memCopy(buf1, s->X + s->offset, s->count - s->offset);
			buf1 += s->count - s->offset;
			count1 -= s->count - s->offset;
			s->offset = 0;
		}
	// сгенерировать
	brngCTRStepR(buf, count, s->state_ex);
}